

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QPointF>::growAppend
          (QCommonArrayOps<QPointF> *this,QPointF *b,QPointF *e)

{
  long lVar1;
  bool bVar2;
  QArrayDataPointer<QPointF> *old_00;
  QPointF *in_RDX;
  QPointF *in_RSI;
  QPodArrayOps<QPointF> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<QPointF> *c;
  GrowthPosition where;
  QArrayDataPointer<QPointF> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    old_00 = (QArrayDataPointer<QPointF> *)((long)in_RDX - (long)in_RSI >> 4);
    c = (QCommonArrayOps<QPointF> *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QArrayDataPointer<QPointF> *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QPointF>::QArrayDataPointer
              ((QArrayDataPointer<QPointF> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<QPointF>,QPointF_const*>
                      ((QPointF **)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<QPointF>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(QPointF **)in_RDX,old_00);
    }
    else {
      QArrayDataPointer<QPointF>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(QPointF **)in_RDX,old_00);
    }
    QPodArrayOps<QPointF>::copyAppend(in_RDI,in_RDX,(QPointF *)old_00);
    QArrayDataPointer<QPointF>::~QArrayDataPointer(old_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }